

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O2

trt_type trop_resolve_type(lysp_node *pn)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  bool bVar4;
  trt_type tVar5;
  trt_type tVar6;
  
  if (pn == (lysp_node *)0x0) {
    return (trt_type)ZEXT816(3);
  }
  uVar1 = pn->nodetype;
  if ((uVar1 & 8) != 0) {
    if (((pn[2].parent != (lysp_node *)0x0) && (pcVar3 = (pn[2].parent)->ref, pcVar3 != (char *)0x0)
        ) && (*pcVar3 != '\0')) goto LAB_0018f0b1;
    pcVar3 = (char *)pn[1].next;
    if (((lysp_node *)pcVar3 != (lysp_node *)0x0) &&
       (*(char *)&((lysp_node *)pcVar3)->parent != '\0')) goto LAB_0018f100;
  }
  if ((uVar1 & 4) != 0) {
    if (((pn[2].parent != (lysp_node *)0x0) && (pcVar3 = (pn[2].parent)->ref, pcVar3 != (char *)0x0)
        ) && (*pcVar3 != '\0')) {
LAB_0018f0b1:
      tVar5.str = pcVar3;
      tVar5._0_8_ = 1;
      return tVar5;
    }
    pcVar3 = (char *)pn[1].next;
    if (((lysp_node *)pcVar3 != (lysp_node *)0x0) &&
       (*(char *)&((lysp_node *)pcVar3)->parent != '\0')) goto LAB_0018f100;
  }
  if (uVar1 != 0x60) {
    pcVar3 = (char *)0x0;
    bVar4 = (uVar1 & 0x20) == 0;
    tVar6._4_4_ = 0;
    tVar6.type = (uint)bVar4 * 3;
    if (!bVar4) {
      pcVar3 = "anyxml";
    }
    tVar6.str = pcVar3;
    return tVar6;
  }
  pcVar3 = "anydata";
LAB_0018f100:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pcVar3;
  return (trt_type)(auVar2 << 0x40);
}

Assistant:

static struct trt_type
trop_resolve_type(const struct lysp_node *pn)
{
    const char *tmp = NULL;

    if (!pn) {
        return TRP_EMPTY_TRT_TYPE;
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if (pn->nodetype == LYS_ANYDATA) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anydata");
    } else if (pn->nodetype & LYS_ANYXML) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anyxml");
    } else {
        return TRP_EMPTY_TRT_TYPE;
    }
}